

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseBlock(Parser *this)

{
  pointer pSVar1;
  
  if (this->m_error != false) {
    return;
  }
  ScopeBegin(this);
  if (this->m_error == false) {
    do {
      pSVar1 = (this->m_currentSymbol)._M_current;
      if ((pSVar1 != (this->m_symbolList->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) &&
         ((((pSVar1->type == End || (pSVar1->type == Else)) || (pSVar1->type == Until)) ||
          (pSVar1->type == While)))) break;
      ParseStatement(this);
    } while (this->m_error != true);
  }
  ScopeEnd(this);
  return;
}

Assistant:

inline_t void Parser::ParseBlock()
	{
		if (m_error)
			return;

		// Push local variable stack frame
		ScopeBegin();

		// Parse each statement until we reach a terminating symbol
		while (!(Check(SymbolType::End) || Check(SymbolType::Else) || Check(SymbolType::Until) || Check(SymbolType::While)) && !m_error)
			ParseStatement();

		// Pop local variable stack frame
		ScopeEnd();
	}